

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeymapper.cpp
# Opt level: O2

QList<QKeyCombination> *
QKeyMapper::possibleKeys(QList<QKeyCombination> *__return_storage_ptr__,QKeyEvent *e)

{
  char16_t cVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  long lVar4;
  qsizetype qVar5;
  int iVar6;
  KeyboardModifiers KVar7;
  QLoggingCategory *pQVar8;
  QDebug *pQVar9;
  undefined4 extraout_var;
  iterator iVar10;
  iterator iVar11;
  char *t;
  long in_FS_OFFSET;
  QList<QKeyCombination> *__range2;
  QKeySequence keySequence;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char> local_b0;
  QDebug local_98;
  QDebug local_90;
  undefined1 local_88 [8];
  QKeySequence local_80;
  QDebug local_78;
  QKeySequence local_70;
  QArrayDataPointer<char16_t> local_68;
  char *local_50;
  Stream *local_48;
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = QtPrivateLogging::lcQpaKeyMapper();
  if (((pQVar8->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_50 = pQVar8->name;
    local_68.d._0_4_ = 2;
    local_68.d._4_4_ = 0;
    local_68.ptr._0_4_ = 0;
    local_68.ptr._4_4_ = 0;
    local_68.size._0_4_ = 0;
    local_68.size._4_4_ = 0;
    QMessageLogger::debug();
    *(undefined4 *)(CONCAT44(local_b0.d._4_4_,(uint)local_b0.d) + 0x34) = 3;
    pQVar9 = QDebug::operator<<((QDebug *)&local_b0,"Computing possible key combinations for");
    local_48 = pQVar9->stream;
    local_48->ref = local_48->ref + 1;
    ::operator<<((Stream *)local_40,(QEvent *)&local_48);
    QDebug::~QDebug((QDebug *)local_40);
    QDebug::~QDebug((QDebug *)&local_48);
    QDebug::~QDebug((QDebug *)&local_b0);
  }
  iVar6 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0x18])();
  *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x10))
            (__return_storage_ptr__,(long *)CONCAT44(extraout_var,iVar6),e);
  if ((__return_storage_ptr__->d).size == 0) {
    if ((e->m_key == 0) || (e->m_key == 0x1ffffff)) {
      pDVar2 = (e->m_text).d.d;
      local_68.d._0_4_ = (int)pDVar2;
      local_68.d._4_4_ = (undefined4)((ulong)pDVar2 >> 0x20);
      pcVar3 = (e->m_text).d.ptr;
      local_68.ptr._0_4_ = SUB84(pcVar3,0);
      local_68.ptr._4_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
      lVar4 = (e->m_text).d.size;
      local_68.size._0_4_ = (undefined4)lVar4;
      local_68.size._4_4_ = (undefined4)((ulong)lVar4 >> 0x20);
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      if (lVar4 != 0) {
        pDVar2 = (e->m_text).d.d;
        local_68.d._0_4_ = (int)pDVar2;
        local_68.d._4_4_ = (undefined4)((ulong)pDVar2 >> 0x20);
        pcVar3 = (e->m_text).d.ptr;
        local_68.ptr._0_4_ = SUB84(pcVar3,0);
        local_68.ptr._4_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
        qVar5 = (e->m_text).d.size;
        local_68.size._0_4_ = (undefined4)qVar5;
        local_68.size._4_4_ = (undefined4)((ulong)qVar5 >> 0x20);
        if (pDVar2 != (Data *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        cVar1 = *pcVar3;
        KVar7 = QKeyEvent::modifiers(e);
        local_b0.d._0_4_ =
             (uint)KVar7.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                   super_QFlagsStorage<Qt::KeyboardModifier>.i | (uint)(ushort)cVar1;
        QList<QKeyCombination>::emplaceBack<QKeyCombination>
                  (__return_storage_ptr__,(QKeyCombination *)&local_b0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      }
    }
    else {
      local_68.d._0_4_ = QKeyEvent::keyCombination(e);
      QList<QKeyCombination>::emplaceBack<QKeyCombination>
                (__return_storage_ptr__,(QKeyCombination *)&local_68);
    }
  }
  pQVar8 = QtPrivateLogging::lcQpaKeyMapper();
  if (((pQVar8->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    pQVar8 = QtPrivateLogging::lcQpaKeyMapper();
    if (((pQVar8->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_50 = pQVar8->name;
      local_68.d._0_4_ = 2;
      local_68.d._4_4_ = 0;
      local_68.ptr._0_4_ = 0;
      local_68.ptr._4_4_ = 0;
      local_68.size._0_4_ = 0;
      local_68.size._4_4_ = 0;
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)&local_b0,"Resulting possible key combinations:");
      QDebug::~QDebug((QDebug *)&local_b0);
    }
    iVar10 = QList<QKeyCombination>::begin(__return_storage_ptr__);
    iVar11 = QList<QKeyCombination>::end(__return_storage_ptr__);
    for (; iVar10.i != iVar11.i; iVar10.i = iVar10.i + 1) {
      local_70.d = (QKeySequencePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QKeySequence::QKeySequence
                (&local_70,(QKeyCombination)(iVar10.i)->combination,(QKeyCombination)0x0,
                 (QKeyCombination)0x0,(QKeyCombination)0x0);
      pQVar8 = QtPrivateLogging::lcQpaKeyMapper();
      if (((pQVar8->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
        local_50 = pQVar8->name;
        local_68.d._0_4_ = 2;
        local_68.d._4_4_ = 0;
        local_68.ptr._0_4_ = 0;
        local_68.ptr._4_4_ = 0;
        local_68.size._0_4_ = 0;
        local_68.size._4_4_ = 0;
        QMessageLogger::debug();
        (local_98.stream)->verbosity = 0;
        pQVar9 = QDebug::operator<<(&local_98,"\t-");
        local_90.stream = pQVar9->stream;
        (local_90.stream)->ref = (local_90.stream)->ref + 1;
        ::operator<<((Stream *)local_88,(QKeyCombination)(int)&local_90);
        pQVar9 = QDebug::operator<<((QDebug *)local_88,"/");
        local_80.d = (QKeySequencePrivate *)pQVar9->stream;
        ((Stream *)local_80.d)->ref = ((Stream *)local_80.d)->ref + 1;
        ::operator<<((Stream *)&local_78,&local_80);
        pQVar9 = QDebug::operator<<(&local_78,"/");
        QKeySequence::toString((QString *)&local_c8,&local_70,NativeText);
        QString::toUtf8_helper((QString *)&local_b0);
        t = local_b0.ptr;
        if (local_b0.ptr == (char *)0x0) {
          t = (char *)&QByteArray::_empty;
        }
        QDebug::operator<<(pQVar9,t);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_b0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
        QDebug::~QDebug(&local_78);
        QDebug::~QDebug((QDebug *)&local_80);
        QDebug::~QDebug((QDebug *)local_88);
        QDebug::~QDebug(&local_90);
        QDebug::~QDebug(&local_98);
      }
      QKeySequence::~QKeySequence(&local_70);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QKeyCombination> QKeyMapper::possibleKeys(const QKeyEvent *e)
{
    qCDebug(lcQpaKeyMapper).verbosity(3) << "Computing possible key combinations for" << e;

    const auto *platformIntegration = QGuiApplicationPrivate::platformIntegration();
    const auto *platformKeyMapper = platformIntegration->keyMapper();
    QList<QKeyCombination> result = platformKeyMapper->possibleKeyCombinations(e);

    if (result.isEmpty()) {
        if (e->key() && (e->key() != Qt::Key_unknown))
            result << e->keyCombination();
        else if (!e->text().isEmpty())
            result << (Qt::Key(e->text().at(0).unicode()) | e->modifiers());
    }

#if QT_CONFIG(shortcut)
    if (lcQpaKeyMapper().isDebugEnabled()) {
        qCDebug(lcQpaKeyMapper) << "Resulting possible key combinations:";
        for (auto keyCombination : result) {
            auto keySequence = QKeySequence(keyCombination);
            qCDebug(lcQpaKeyMapper).verbosity(0) << "\t-"
                << keyCombination << "/" << keySequence << "/"
                << qUtf8Printable(keySequence.toString(QKeySequence::NativeText));
        }
    }
#endif

    return result;
}